

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

void __thiscall
r_exec::_TPX::filter_icst_components
          (_TPX *this,ICST *icst,uint64_t icst_index,
          vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_> *components)

{
  _Fact *p_Var1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  void *pvVar6;
  vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *pvVar7;
  reference p;
  reference pvVar8;
  _Fact *p_Var9;
  uint64_t *local_80;
  uint64_t i;
  P<r_exec::_Fact> local_60;
  P<r_exec::_Fact> component;
  iterator __end2;
  iterator __begin2;
  vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *__range2;
  uint64_t j;
  uint64_t *found;
  uint64_t found_component_count;
  vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_> *components_local;
  uint64_t icst_index_local;
  ICST *icst_local;
  _TPX *this_local;
  
  found = (uint64_t *)0x0;
  sVar4 = std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::size
                    (&icst->components);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  for (__range2 = (vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *)0x0;
      pvVar7 = (vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *)
               std::vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>::size
                         (components), __range2 < pvVar7;
      __range2 = (vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> *)
                 ((long)&(__range2->
                         super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1)) {
    __end2 = std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::begin
                       (&icst->components);
    component.object =
         (_Object *)
         std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::end
                   (&icst->components);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
                                       *)&component), bVar3) {
      p = __gnu_cxx::
          __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
          ::operator*(&__end2);
      core::P<r_exec::_Fact>::P(&local_60,p);
      pvVar8 = std::vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>::
               operator[](components,(size_type)__range2);
      if ((pvVar8->discarded & 1U) == 0) {
        pvVar8 = std::vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>::
                 operator[](components,(size_type)__range2);
        p_Var1 = pvVar8->object;
        p_Var9 = core::P::operator_cast_to__Fact_((P *)&local_60);
        if (p_Var1 == p_Var9) {
          *(vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_> **)
           ((long)pvVar6 + (long)found * 8) = __range2;
          found = (uint64_t *)((long)found + 1);
        }
      }
      core::P<r_exec::_Fact>::~P(&local_60);
      __gnu_cxx::
      __normal_iterator<core::P<r_exec::_Fact>_*,_std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>_>
      ::operator++(&__end2);
    }
  }
  if (found == (uint64_t *)0x0) {
    pvVar8 = std::vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>::
             operator[](components,icst_index);
    pvVar8->discarded = true;
  }
  else {
    for (local_80 = (uint64_t *)0x0; local_80 < found; local_80 = (uint64_t *)((long)local_80 + 1))
    {
      pvVar8 = std::vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>::
               operator[](components,*(size_type *)((long)pvVar6 + (long)local_80 * 8));
      pvVar8->discarded = true;
    }
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  return;
}

Assistant:

void _TPX::filter_icst_components(ICST *icst, uint64_t icst_index, std::vector<Component> &components)
{
    uint64_t found_component_count = 0;
    uint64_t *found = new uint64_t[icst->components.size()];

    for (uint64_t j = 0; j < components.size(); ++j) {
        for (P<_Fact> component : icst->components) {
            if (components[j].discarded) {
                continue;
            }

            if (components[j].object == component) {
                found[found_component_count] = j;
                ++found_component_count;
            }
        }
    }

    if (found_component_count > 0) { // some of the icst components are already in the inputs: discard said components, keep the icst.
        for (uint64_t i = 0; i < found_component_count; ++i) {
            components[found[i]].discarded = true;
        }
    } else { // none of the icst components are in the inputs; this can only happen because the icst shares one timestamp with the TPX's target: discard the icst.
        components[icst_index].discarded = true;
    }

    delete[] found;
}